

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  int iVar1;
  int iVar2;
  int *in_FS_OFFSET;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this->pendingFuntors_,cb);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  iVar1 = this->threadId_;
  iVar2 = *in_FS_OFFSET;
  if (iVar2 == 0) {
    CurrentThread::cacheTid();
    iVar2 = *in_FS_OFFSET;
  }
  if ((iVar1 == iVar2) && (this->callingPendingFunctors_ != true)) {
    return;
  }
  wakeup(this);
  return;
}

Assistant:

void EventLoop::queueInLoop(Functor cb) {
    {
        MutexLockGuard lock(mutex_);
        pendingFuntors_.push_back(std::move(cb));
    }
    if(!isInLoopThread() || callingPendingFunctors_) {
        wakeup();
    }
}